

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::DumpOp
               (OpCode op,LayoutSize layoutSize,ByteCodeReader *reader,FunctionBody *dumpFunction)

{
  code *pcVar1;
  bool bVar2;
  _E _Var3;
  char16 *pcVar4;
  OpLayoutEmpty *data;
  OpLayoutReg1_Small *data_00;
  OpLayoutReg1_Medium *data_01;
  OpLayoutReg1_Large *data_02;
  OpLayoutProfiledReg2_Small *data_03;
  OpLayoutProfiledReg2_Medium *data_04;
  OpLayoutProfiledReg2_Large *data_05;
  OpLayoutReg2_Small *data_06;
  OpLayoutReg2_Medium *data_07;
  OpLayoutReg2_Large *data_08;
  OpLayoutProfiledReg3_Small *data_09;
  OpLayoutProfiledReg3_Medium *data_10;
  OpLayoutProfiledReg3_Large *data_11;
  OpLayoutReg3_Small *data_12;
  OpLayoutReg3_Medium *data_13;
  OpLayoutReg3_Large *data_14;
  OpLayoutReg3U_Small *data_15;
  OpLayoutReg3U_Medium *data_16;
  OpLayoutReg3U_Large *data_17;
  OpLayoutReg4_Small *data_18;
  OpLayoutReg4_Medium *data_19;
  OpLayoutReg4_Large *data_20;
  OpLayoutReg4U_Small *data_21;
  OpLayoutReg4U_Medium *data_22;
  OpLayoutReg4U_Large *data_23;
  OpLayoutReg5U_Small *data_24;
  OpLayoutReg5U_Medium *data_25;
  OpLayoutReg5U_Large *data_26;
  OpLayoutProfiledReg1Unsigned1_Small *data_27;
  OpLayoutProfiledReg1Unsigned1_Medium *data_28;
  OpLayoutProfiledReg1Unsigned1_Large *data_29;
  OpLayoutReg1Unsigned1_Small *data_30;
  OpLayoutReg1Unsigned1_Medium *data_31;
  OpLayoutReg1Unsigned1_Large *data_32;
  OpLayoutReg2U_Small *data_33;
  OpLayoutReg2U_Medium *data_34;
  OpLayoutReg2U_Large *data_35;
  OpLayoutReg2B1_Small *data_36;
  OpLayoutReg2B1_Medium *data_37;
  OpLayoutReg2B1_Large *data_38;
  OpLayoutReg3B1_Small *data_39;
  OpLayoutReg3B1_Medium *data_40;
  OpLayoutReg3B1_Large *data_41;
  OpLayoutReg3C_Small *data_42;
  OpLayoutReg3C_Medium *data_43;
  OpLayoutReg3C_Large *data_44;
  OpLayoutProfiledArg_Small *data_45;
  OpLayoutProfiledArg_Medium *data_46;
  OpLayoutProfiledArg_Large *data_47;
  OpLayoutArg_Small *data_48;
  OpLayoutArg_Medium *data_49;
  OpLayoutArg_Large *data_50;
  OpLayoutArgNoSrc_Small *data_51;
  OpLayoutArgNoSrc_Medium *data_52;
  OpLayoutArgNoSrc_Large *data_53;
  OpLayoutBrLong *data_54;
  OpLayoutBr *data_55;
  OpLayoutBrReg1_Small *data_56;
  OpLayoutBrReg1_Medium *data_57;
  OpLayoutBrReg1_Large *data_58;
  OpLayoutBrReg2_Small *data_59;
  OpLayoutBrReg2_Medium *data_60;
  OpLayoutBrReg2_Large *data_61;
  OpLayoutBrReg1Unsigned1_Small *data_62;
  OpLayoutBrReg1Unsigned1_Medium *data_63;
  OpLayoutBrReg1Unsigned1_Large *data_64;
  OpLayoutBrS *data_65;
  OpLayoutBrProperty *data_66;
  OpLayoutBrLocalProperty *data_67;
  OpLayoutBrEnvProperty *data_68;
  OpLayoutStartCall *data_69;
  OpLayoutProfiledCallI_Small *data_70;
  OpLayoutProfiledCallI_Medium *data_71;
  OpLayoutProfiledCallI_Large *data_72;
  OpLayoutCallI_Small *data_73;
  OpLayoutCallI_Medium *data_74;
  OpLayoutCallI_Large *data_75;
  OpLayoutProfiled2CallI_Small *data_76;
  OpLayoutProfiled2CallI_Medium *data_77;
  OpLayoutProfiled2CallI_Large *data_78;
  OpLayoutProfiledCallIFlags_Small *data_79;
  OpLayoutProfiledCallIFlags_Medium *data_80;
  OpLayoutProfiledCallIFlags_Large *data_81;
  OpLayoutCallIFlags_Small *data_82;
  OpLayoutCallIFlags_Medium *data_83;
  OpLayoutCallIFlags_Large *data_84;
  OpLayoutProfiledCallIWithICIndex_Small *data_85;
  OpLayoutProfiledCallIWithICIndex_Medium *data_86;
  OpLayoutProfiledCallIWithICIndex_Large *data_87;
  OpLayoutCallIWithICIndex_Small *data_88;
  OpLayoutCallIWithICIndex_Medium *data_89;
  OpLayoutCallIWithICIndex_Large *data_90;
  OpLayoutProfiledCallIFlagsWithICIndex_Small *data_91;
  OpLayoutProfiledCallIFlagsWithICIndex_Medium *data_92;
  OpLayoutProfiledCallIFlagsWithICIndex_Large *data_93;
  OpLayoutCallIFlagsWithICIndex_Small *data_94;
  OpLayoutCallIFlagsWithICIndex_Medium *data_95;
  OpLayoutCallIFlagsWithICIndex_Large *data_96;
  OpLayoutProfiledCallIExtended_Small *data_97;
  OpLayoutProfiledCallIExtended_Medium *data_98;
  OpLayoutProfiledCallIExtended_Large *data_99;
  OpLayoutCallIExtended_Small *data_x00100;
  OpLayoutCallIExtended_Medium *data_x00101;
  OpLayoutCallIExtended_Large *data_x00102;
  OpLayoutProfiled2CallIExtended_Small *data_x00103;
  OpLayoutProfiled2CallIExtended_Medium *data_x00104;
  OpLayoutProfiled2CallIExtended_Large *data_x00105;
  OpLayoutProfiledCallIExtendedFlags_Small *data_x00106;
  OpLayoutProfiledCallIExtendedFlags_Medium *data_x00107;
  OpLayoutProfiledCallIExtendedFlags_Large *data_x00108;
  OpLayoutCallIExtendedFlags_Small *data_x00109;
  OpLayoutCallIExtendedFlags_Medium *data_x00110;
  OpLayoutCallIExtendedFlags_Large *data_x00111;
  OpLayoutProfiledCallIExtendedWithICIndex_Small *data_x00112;
  OpLayoutProfiledCallIExtendedWithICIndex_Medium *data_x00113;
  OpLayoutProfiledCallIExtendedWithICIndex_Large *data_x00114;
  OpLayoutCallIExtendedWithICIndex_Small *data_x00115;
  OpLayoutCallIExtendedWithICIndex_Medium *data_x00116;
  OpLayoutCallIExtendedWithICIndex_Large *data_x00117;
  OpLayoutProfiledCallIExtendedFlagsWithICIndex_Small *data_x00118;
  OpLayoutProfiledCallIExtendedFlagsWithICIndex_Medium *data_x00119;
  OpLayoutProfiledCallIExtendedFlagsWithICIndex_Large *data_x00120;
  OpLayoutCallIExtendedFlagsWithICIndex_Small *data_x00121;
  OpLayoutCallIExtendedFlagsWithICIndex_Medium *data_x00122;
  OpLayoutCallIExtendedFlagsWithICIndex_Large *data_x00123;
  OpLayoutProfiledElementI_Small *data_x00124;
  OpLayoutProfiledElementI_Medium *data_x00125;
  OpLayoutProfiledElementI_Large *data_x00126;
  OpLayoutElementI_Small *data_x00127;
  OpLayoutElementI_Medium *data_x00128;
  OpLayoutElementI_Large *data_x00129;
  OpLayoutElementUnsigned1_Small *data_x00130;
  OpLayoutElementUnsigned1_Medium *data_x00131;
  OpLayoutElementUnsigned1_Large *data_x00132;
  OpLayoutElementC_Small *data_x00133;
  OpLayoutElementC_Medium *data_x00134;
  OpLayoutElementC_Large *data_x00135;
  OpLayoutElementScopedC_Small *data_x00136;
  OpLayoutElementScopedC_Medium *data_x00137;
  OpLayoutElementScopedC_Large *data_x00138;
  OpLayoutProfiledElementCP_Small *data_x00139;
  OpLayoutProfiledElementCP_Medium *data_x00140;
  OpLayoutProfiledElementCP_Large *data_x00141;
  OpLayoutElementCP_Small *data_x00142;
  OpLayoutElementCP_Medium *data_x00143;
  OpLayoutElementCP_Large *data_x00144;
  OpLayoutElementP_Small *data_x00145;
  OpLayoutElementP_Medium *data_x00146;
  OpLayoutElementP_Large *data_x00147;
  OpLayoutElementPIndexed_Small *data_x00148;
  OpLayoutElementPIndexed_Medium *data_x00149;
  OpLayoutElementPIndexed_Large *data_x00150;
  OpLayoutElementRootCP_Small *data_x00151;
  OpLayoutElementRootCP_Medium *data_x00152;
  OpLayoutElementRootCP_Large *data_x00153;
  OpLayoutElementC2_Small *data_x00154;
  OpLayoutElementC2_Medium *data_x00155;
  OpLayoutElementC2_Large *data_x00156;
  OpLayoutElementScopedC2_Small *data_x00157;
  OpLayoutElementScopedC2_Medium *data_x00158;
  OpLayoutElementScopedC2_Large *data_x00159;
  OpLayoutProfiledElementSlot_Small *data_x00160;
  OpLayoutProfiledElementSlot_Medium *data_x00161;
  OpLayoutProfiledElementSlot_Large *data_x00162;
  OpLayoutElementSlot_Small *data_x00163;
  OpLayoutElementSlot_Medium *data_x00164;
  OpLayoutElementSlot_Large *data_x00165;
  OpLayoutProfiledElementSlotI1_Small *data_x00166;
  OpLayoutProfiledElementSlotI1_Medium *data_x00167;
  OpLayoutProfiledElementSlotI1_Large *data_x00168;
  OpLayoutElementSlotI1_Small *data_x00169;
  OpLayoutElementSlotI1_Medium *data_x00170;
  OpLayoutElementSlotI1_Large *data_x00171;
  OpLayoutProfiledElementSlotI2_Small *data_x00172;
  OpLayoutProfiledElementSlotI2_Medium *data_x00173;
  OpLayoutProfiledElementSlotI2_Large *data_x00174;
  OpLayoutElementSlotI2_Small *data_x00175;
  OpLayoutElementSlotI2_Medium *data_x00176;
  OpLayoutElementSlotI2_Large *data_x00177;
  OpLayoutProfiledElementSlotI3_Small *data_x00178;
  OpLayoutProfiledElementSlotI3_Medium *data_x00179;
  OpLayoutProfiledElementSlotI3_Large *data_x00180;
  OpLayoutElementSlotI3_Small *data_x00181;
  OpLayoutElementSlotI3_Medium *data_x00182;
  OpLayoutElementSlotI3_Large *data_x00183;
  OpLayoutElementU_Small *data_x00184;
  OpLayoutElementU_Medium *data_x00185;
  OpLayoutElementU_Large *data_x00186;
  OpLayoutElementScopedU_Small *data_x00187;
  OpLayoutElementScopedU_Medium *data_x00188;
  OpLayoutElementScopedU_Large *data_x00189;
  OpLayoutElementRootU_Small *data_x00190;
  OpLayoutElementRootU_Medium *data_x00191;
  OpLayoutElementRootU_Large *data_x00192;
  OpLayoutW1 *data_x00193;
  OpLayoutReg2Int1_Small *data_x00194;
  OpLayoutReg2Int1_Medium *data_x00195;
  OpLayoutReg2Int1_Large *data_x00196;
  OpLayoutAuxNoReg *playout;
  OpLayoutAuxiliary *playout_00;
  OpLayoutProfiledAuxiliary *data_x00197;
  OpLayoutReg2Aux *playout_01;
  OpLayoutReg5_Small *data_x00198;
  OpLayoutReg5_Medium *data_x00199;
  OpLayoutReg5_Large *data_x00200;
  OpLayoutUnsigned1_Small *data_x00201;
  OpLayoutUnsigned1_Medium *data_x00202;
  OpLayoutUnsigned1_Large *data_x00203;
  undefined4 *puVar5;
  OpLayoutType local_24;
  FunctionBody *pFStack_20;
  OpLayoutType nType;
  FunctionBody *dumpFunction_local;
  ByteCodeReader *reader_local;
  LayoutSize layoutSize_local;
  OpCode op_local;
  
  pFStack_20 = dumpFunction;
  pcVar4 = OpCodeUtil::GetOpCodeName(op);
  Output::Print(L"%-20s",pcVar4);
  local_24 = OpCodeUtil::GetOpCodeLayout(op);
  _Var3 = OpLayoutType::operator_cast_to__E(&local_24);
  switch(layoutSize * 0x4e + _Var3) {
  case SmallLayout:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x2e,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data = ByteCodeReader::Empty(reader);
    DumpEmpty(op,data,pFStack_20,reader);
    break;
  case MediumLayout:
    data_00 = ByteCodeReader::Reg1_Small(reader);
    DumpReg1<Js::OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_00,pFStack_20,reader);
    break;
  case LargeLayout:
    data_06 = ByteCodeReader::Reg2_Small(reader);
    DumpReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_06,pFStack_20,reader);
    break;
  case LayoutCount:
    data_03 = ByteCodeReader::ProfiledReg2_Small(reader);
    DumpProfiledReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_03,pFStack_20,reader);
    break;
  case 4:
    data_12 = ByteCodeReader::Reg3_Small(reader);
    DumpReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_12,pFStack_20,reader);
    break;
  case 5:
    data_09 = ByteCodeReader::ProfiledReg3_Small(reader);
    DumpProfiledReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_09,pFStack_20,reader);
    break;
  case 6:
    data_15 = ByteCodeReader::Reg3U_Small(reader);
    DumpReg3U<Js::OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_15,pFStack_20,reader);
    break;
  case 7:
    data_18 = ByteCodeReader::Reg4_Small(reader);
    DumpReg4<Js::OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_18,pFStack_20,reader);
    break;
  case 8:
    data_21 = ByteCodeReader::Reg4U_Small(reader);
    DumpReg4U<Js::OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_21,pFStack_20,reader);
    break;
  case 9:
    data_24 = ByteCodeReader::Reg5U_Small(reader);
    DumpReg5U<Js::OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_24,pFStack_20,reader);
    break;
  case 10:
    data_30 = ByteCodeReader::Reg1Unsigned1_Small(reader);
    DumpReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_30,pFStack_20,reader);
    break;
  case 0xb:
    data_27 = ByteCodeReader::ProfiledReg1Unsigned1_Small(reader);
    DumpProfiledReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_27,pFStack_20,reader);
    break;
  case 0xc:
    data_33 = ByteCodeReader::Reg2U_Small(reader);
    DumpReg2U<Js::OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_33,pFStack_20,reader);
    break;
  case 0xd:
    data_36 = ByteCodeReader::Reg2B1_Small(reader);
    DumpReg2B1<Js::OpLayoutT_Reg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_36,pFStack_20,reader);
    break;
  case 0xe:
    data_39 = ByteCodeReader::Reg3B1_Small(reader);
    DumpReg3B1<Js::OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_39,pFStack_20,reader);
    break;
  case 0xf:
    data_42 = ByteCodeReader::Reg3C_Small(reader);
    DumpReg3C<Js::OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_42,pFStack_20,reader);
    break;
  case 0x10:
    data_48 = ByteCodeReader::Arg_Small(reader);
    DumpArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_48,pFStack_20,reader);
    break;
  case 0x11:
    data_45 = ByteCodeReader::ProfiledArg_Small(reader);
    DumpProfiledArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_45,pFStack_20,reader);
    break;
  case 0x12:
    data_51 = ByteCodeReader::ArgNoSrc_Small(reader);
    DumpArgNoSrc<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_51,pFStack_20,reader);
    break;
  case 0x13:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x3e,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_54 = ByteCodeReader::BrLong(reader);
    DumpBrLong(op,data_54,pFStack_20,reader);
    break;
  case 0x14:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x40,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_55 = ByteCodeReader::Br(reader);
    DumpBr(op,data_55,pFStack_20,reader);
    break;
  case 0x15:
    data_56 = ByteCodeReader::BrReg1_Small(reader);
    DumpBrReg1<Js::OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_56,pFStack_20,reader);
    break;
  case 0x16:
    data_59 = ByteCodeReader::BrReg2_Small(reader);
    DumpBrReg2<Js::OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_59,pFStack_20,reader);
    break;
  case 0x17:
    data_62 = ByteCodeReader::BrReg1Unsigned1_Small(reader);
    DumpBrReg1Unsigned1<Js::OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_62,pFStack_20,reader);
    break;
  case 0x18:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x44,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_65 = ByteCodeReader::BrS(reader);
    DumpBrS(op,data_65,pFStack_20,reader);
    break;
  case 0x19:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x45,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_66 = ByteCodeReader::BrProperty(reader);
    DumpBrProperty(op,data_66,pFStack_20,reader);
    break;
  case 0x1a:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x46,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_67 = ByteCodeReader::BrLocalProperty(reader);
    DumpBrLocalProperty(op,data_67,pFStack_20,reader);
    break;
  case 0x1b:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x47,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_68 = ByteCodeReader::BrEnvProperty(reader);
    DumpBrEnvProperty(op,data_68,pFStack_20,reader);
    break;
  case 0x1c:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x48,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_69 = ByteCodeReader::StartCall(reader);
    DumpStartCall(op,data_69,pFStack_20,reader);
    break;
  case 0x1d:
    data_73 = ByteCodeReader::CallI_Small(reader);
    DumpCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_73,pFStack_20,reader);
    break;
  case 0x1e:
    data_70 = ByteCodeReader::ProfiledCallI_Small(reader);
    DumpProfiledCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_70,pFStack_20,reader);
    break;
  case 0x1f:
    data_76 = ByteCodeReader::Profiled2CallI_Small(reader);
    DumpProfiled2CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_76,pFStack_20,reader);
    break;
  case 0x20:
    data_82 = ByteCodeReader::CallIFlags_Small(reader);
    DumpCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_82,pFStack_20,reader);
    break;
  case 0x21:
    data_79 = ByteCodeReader::ProfiledCallIFlags_Small(reader);
    DumpProfiledCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_79,pFStack_20,reader);
    break;
  case 0x22:
    data_88 = ByteCodeReader::CallIWithICIndex_Small(reader);
    DumpCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_88,pFStack_20,reader);
    break;
  case 0x23:
    data_85 = ByteCodeReader::ProfiledCallIWithICIndex_Small(reader);
    DumpProfiledCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_85,pFStack_20,reader);
    break;
  case 0x24:
    data_94 = ByteCodeReader::CallIFlagsWithICIndex_Small(reader);
    DumpCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_94,pFStack_20,reader);
    break;
  case 0x25:
    data_91 = ByteCodeReader::ProfiledCallIFlagsWithICIndex_Small(reader);
    DumpProfiledCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_91,pFStack_20,reader);
    break;
  case 0x26:
    data_x00100 = ByteCodeReader::CallIExtended_Small(reader);
    DumpCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00100,pFStack_20,reader);
    break;
  case 0x27:
    data_97 = ByteCodeReader::ProfiledCallIExtended_Small(reader);
    DumpProfiledCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_97,pFStack_20,reader);
    break;
  case 0x28:
    data_x00103 = ByteCodeReader::Profiled2CallIExtended_Small(reader);
    DumpProfiled2CallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00103,pFStack_20,reader);
    break;
  case 0x29:
    data_x00109 = ByteCodeReader::CallIExtendedFlags_Small(reader);
    DumpCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00109,pFStack_20,reader);
    break;
  case 0x2a:
    data_x00106 = ByteCodeReader::ProfiledCallIExtendedFlags_Small(reader);
    DumpProfiledCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00106,pFStack_20,reader);
    break;
  case 0x2b:
    data_x00115 = ByteCodeReader::CallIExtendedWithICIndex_Small(reader);
    DumpCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00115,pFStack_20,reader);
    break;
  case 0x2c:
    data_x00112 = ByteCodeReader::ProfiledCallIExtendedWithICIndex_Small(reader);
    DumpProfiledCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00112,pFStack_20,reader);
    break;
  case 0x2d:
    data_x00121 = ByteCodeReader::CallIExtendedFlagsWithICIndex_Small(reader);
    DumpCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00121,pFStack_20,reader);
    break;
  case 0x2e:
    data_x00118 = ByteCodeReader::ProfiledCallIExtendedFlagsWithICIndex_Small(reader);
    DumpProfiledCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00118,pFStack_20,reader);
    break;
  case 0x2f:
    data_x00127 = ByteCodeReader::ElementI_Small(reader);
    DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00127,pFStack_20,reader);
    break;
  case 0x30:
    data_x00124 = ByteCodeReader::ProfiledElementI_Small(reader);
    DumpProfiledElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00124,pFStack_20,reader);
    break;
  case 0x31:
    data_x00130 = ByteCodeReader::ElementUnsigned1_Small(reader);
    DumpElementUnsigned1<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00130,pFStack_20,reader);
    break;
  case 0x32:
    data_x00133 = ByteCodeReader::ElementC_Small(reader);
    DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00133,pFStack_20,reader);
    break;
  case 0x33:
    data_x00136 = ByteCodeReader::ElementScopedC_Small(reader);
    DumpElementScopedC<Js::OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00136,pFStack_20,reader);
    break;
  case 0x34:
    data_x00142 = ByteCodeReader::ElementCP_Small(reader);
    DumpElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00142,pFStack_20,reader);
    break;
  case 0x35:
    data_x00139 = ByteCodeReader::ProfiledElementCP_Small(reader);
    DumpProfiledElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00139,pFStack_20,reader);
    break;
  case 0x36:
    data_x00145 = ByteCodeReader::ElementP_Small(reader);
    DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00145,pFStack_20,reader);
    break;
  case 0x37:
    data_x00148 = ByteCodeReader::ElementPIndexed_Small(reader);
    DumpElementPIndexed<Js::OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00148,pFStack_20,reader);
    break;
  case 0x38:
    data_x00151 = ByteCodeReader::ElementRootCP_Small(reader);
    DumpElementRootCP<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00151,pFStack_20,reader);
    break;
  case 0x39:
    data_x00154 = ByteCodeReader::ElementC2_Small(reader);
    DumpElementC2<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00154,pFStack_20,reader);
    break;
  case 0x3a:
    data_x00157 = ByteCodeReader::ElementScopedC2_Small(reader);
    DumpElementScopedC2<Js::OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00157,pFStack_20,reader);
    break;
  case 0x3b:
    data_x00163 = ByteCodeReader::ElementSlot_Small(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00163,pFStack_20,reader);
    break;
  case 0x3c:
    data_x00160 = ByteCodeReader::ProfiledElementSlot_Small(reader);
    DumpProfiledElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00160,pFStack_20,reader);
    break;
  case 0x3d:
    data_x00169 = ByteCodeReader::ElementSlotI1_Small(reader);
    DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00169,pFStack_20,reader);
    break;
  case 0x3e:
    data_x00166 = ByteCodeReader::ProfiledElementSlotI1_Small(reader);
    DumpProfiledElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00166,pFStack_20,reader);
    break;
  case 0x3f:
    data_x00175 = ByteCodeReader::ElementSlotI2_Small(reader);
    DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00175,pFStack_20,reader);
    break;
  case 0x40:
    data_x00172 = ByteCodeReader::ProfiledElementSlotI2_Small(reader);
    DumpProfiledElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00172,pFStack_20,reader);
    break;
  case 0x41:
    data_x00181 = ByteCodeReader::ElementSlotI3_Small(reader);
    DumpElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00181,pFStack_20,reader);
    break;
  case 0x42:
    data_x00178 = ByteCodeReader::ProfiledElementSlotI3_Small(reader);
    DumpProfiledElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
              (op,data_x00178,pFStack_20,reader);
    break;
  case 0x43:
    data_x00184 = ByteCodeReader::ElementU_Small(reader);
    DumpElementU<Js::OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00184,pFStack_20,reader);
    break;
  case 0x44:
    data_x00187 = ByteCodeReader::ElementScopedU_Small(reader);
    DumpElementScopedU<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00187,pFStack_20,reader);
    break;
  case 0x45:
    data_x00190 = ByteCodeReader::ElementRootU_Small(reader);
    DumpElementRootU<Js::OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00190,pFStack_20,reader);
    break;
  case 0x46:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x62,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_x00193 = ByteCodeReader::W1(reader);
    DumpW1(op,data_x00193,pFStack_20,reader);
    break;
  case 0x47:
    data_x00194 = ByteCodeReader::Reg2Int1_Small(reader);
    DumpReg2Int1<Js::OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00194,pFStack_20,reader);
    break;
  case 0x48:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,100,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    playout = ByteCodeReader::AuxNoReg(reader);
    DumpAuxNoReg(op,playout,pFStack_20,reader);
    break;
  case 0x49:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x65,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    playout_00 = ByteCodeReader::Auxiliary(reader);
    DumpAuxiliary(op,playout_00,pFStack_20,reader);
    break;
  case 0x4a:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x65,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_x00197 = ByteCodeReader::ProfiledAuxiliary(reader);
    DumpProfiledAuxiliary(op,data_x00197,pFStack_20,reader);
    break;
  case 0x4b:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypes.h"
                                  ,0x66,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    playout_01 = ByteCodeReader::Reg2Aux(reader);
    DumpReg2Aux(op,playout_01,pFStack_20,reader);
    break;
  case 0x4c:
    data_x00198 = ByteCodeReader::Reg5_Small(reader);
    DumpReg5<Js::OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00198,pFStack_20,reader);
    break;
  case 0x4d:
    data_x00201 = ByteCodeReader::Unsigned1_Small(reader);
    DumpUnsigned1<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00201,pFStack_20,reader);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x691,"(false)","Unknown OpLayout");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    break;
  case 0x4f:
    data_01 = ByteCodeReader::Reg1_Medium(reader);
    DumpReg1<Js::OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_01,pFStack_20,reader);
    break;
  case 0x50:
    data_07 = ByteCodeReader::Reg2_Medium(reader);
    DumpReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_07,pFStack_20,reader);
    break;
  case 0x51:
    data_04 = ByteCodeReader::ProfiledReg2_Medium(reader);
    DumpProfiledReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_04,pFStack_20,reader);
    break;
  case 0x52:
    data_13 = ByteCodeReader::Reg3_Medium(reader);
    DumpReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_13,pFStack_20,reader);
    break;
  case 0x53:
    data_10 = ByteCodeReader::ProfiledReg3_Medium(reader);
    DumpProfiledReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_10,pFStack_20,reader);
    break;
  case 0x54:
    data_16 = ByteCodeReader::Reg3U_Medium(reader);
    DumpReg3U<Js::OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_16,pFStack_20,reader);
    break;
  case 0x55:
    data_19 = ByteCodeReader::Reg4_Medium(reader);
    DumpReg4<Js::OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_19,pFStack_20,reader);
    break;
  case 0x56:
    data_22 = ByteCodeReader::Reg4U_Medium(reader);
    DumpReg4U<Js::OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_22,pFStack_20,reader);
    break;
  case 0x57:
    data_25 = ByteCodeReader::Reg5U_Medium(reader);
    DumpReg5U<Js::OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_25,pFStack_20,reader);
    break;
  case 0x58:
    data_31 = ByteCodeReader::Reg1Unsigned1_Medium(reader);
    DumpReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_31,pFStack_20,reader);
    break;
  case 0x59:
    data_28 = ByteCodeReader::ProfiledReg1Unsigned1_Medium(reader);
    DumpProfiledReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_28,pFStack_20,reader);
    break;
  case 0x5a:
    data_34 = ByteCodeReader::Reg2U_Medium(reader);
    DumpReg2U<Js::OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_34,pFStack_20,reader);
    break;
  case 0x5b:
    data_37 = ByteCodeReader::Reg2B1_Medium(reader);
    DumpReg2B1<Js::OpLayoutT_Reg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_37,pFStack_20,reader);
    break;
  case 0x5c:
    data_40 = ByteCodeReader::Reg3B1_Medium(reader);
    DumpReg3B1<Js::OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_40,pFStack_20,reader);
    break;
  case 0x5d:
    data_43 = ByteCodeReader::Reg3C_Medium(reader);
    DumpReg3C<Js::OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_43,pFStack_20,reader);
    break;
  case 0x5e:
    data_49 = ByteCodeReader::Arg_Medium(reader);
    DumpArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_49,pFStack_20,reader);
    break;
  case 0x5f:
    data_46 = ByteCodeReader::ProfiledArg_Medium(reader);
    DumpProfiledArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_46,pFStack_20,reader);
    break;
  case 0x60:
    data_52 = ByteCodeReader::ArgNoSrc_Medium(reader);
    DumpArgNoSrc<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_52,pFStack_20,reader);
    break;
  case 99:
    data_57 = ByteCodeReader::BrReg1_Medium(reader);
    DumpBrReg1<Js::OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_57,pFStack_20,reader);
    break;
  case 100:
    data_60 = ByteCodeReader::BrReg2_Medium(reader);
    DumpBrReg2<Js::OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_60,pFStack_20,reader);
    break;
  case 0x65:
    data_63 = ByteCodeReader::BrReg1Unsigned1_Medium(reader);
    DumpBrReg1Unsigned1<Js::OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_63,pFStack_20,reader);
    break;
  case 0x6b:
    data_74 = ByteCodeReader::CallI_Medium(reader);
    DumpCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_74,pFStack_20,reader);
    break;
  case 0x6c:
    data_71 = ByteCodeReader::ProfiledCallI_Medium(reader);
    DumpProfiledCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_71,pFStack_20,reader);
    break;
  case 0x6d:
    data_77 = ByteCodeReader::Profiled2CallI_Medium(reader);
    DumpProfiled2CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_77,pFStack_20,reader);
    break;
  case 0x6e:
    data_83 = ByteCodeReader::CallIFlags_Medium(reader);
    DumpCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_83,pFStack_20,reader);
    break;
  case 0x6f:
    data_80 = ByteCodeReader::ProfiledCallIFlags_Medium(reader);
    DumpProfiledCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_80,pFStack_20,reader);
    break;
  case 0x70:
    data_89 = ByteCodeReader::CallIWithICIndex_Medium(reader);
    DumpCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_89,pFStack_20,reader);
    break;
  case 0x71:
    data_86 = ByteCodeReader::ProfiledCallIWithICIndex_Medium(reader);
    DumpProfiledCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_86,pFStack_20,reader);
    break;
  case 0x72:
    data_95 = ByteCodeReader::CallIFlagsWithICIndex_Medium(reader);
    DumpCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_95,pFStack_20,reader);
    break;
  case 0x73:
    data_92 = ByteCodeReader::ProfiledCallIFlagsWithICIndex_Medium(reader);
    DumpProfiledCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_92,pFStack_20,reader);
    break;
  case 0x74:
    data_x00101 = ByteCodeReader::CallIExtended_Medium(reader);
    DumpCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00101,pFStack_20,reader);
    break;
  case 0x75:
    data_98 = ByteCodeReader::ProfiledCallIExtended_Medium(reader);
    DumpProfiledCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_98,pFStack_20,reader);
    break;
  case 0x76:
    data_x00104 = ByteCodeReader::Profiled2CallIExtended_Medium(reader);
    DumpProfiled2CallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00104,pFStack_20,reader);
    break;
  case 0x77:
    data_x00110 = ByteCodeReader::CallIExtendedFlags_Medium(reader);
    DumpCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00110,pFStack_20,reader);
    break;
  case 0x78:
    data_x00107 = ByteCodeReader::ProfiledCallIExtendedFlags_Medium(reader);
    DumpProfiledCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00107,pFStack_20,reader);
    break;
  case 0x79:
    data_x00116 = ByteCodeReader::CallIExtendedWithICIndex_Medium(reader);
    DumpCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00116,pFStack_20,reader);
    break;
  case 0x7a:
    data_x00113 = ByteCodeReader::ProfiledCallIExtendedWithICIndex_Medium(reader);
    DumpProfiledCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00113,pFStack_20,reader);
    break;
  case 0x7b:
    data_x00122 = ByteCodeReader::CallIExtendedFlagsWithICIndex_Medium(reader);
    DumpCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00122,pFStack_20,reader);
    break;
  case 0x7c:
    data_x00119 = ByteCodeReader::ProfiledCallIExtendedFlagsWithICIndex_Medium(reader);
    DumpProfiledCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00119,pFStack_20,reader);
    break;
  case 0x7d:
    data_x00128 = ByteCodeReader::ElementI_Medium(reader);
    DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00128,pFStack_20,reader);
    break;
  case 0x7e:
    data_x00125 = ByteCodeReader::ProfiledElementI_Medium(reader);
    DumpProfiledElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00125,pFStack_20,reader);
    break;
  case 0x7f:
    data_x00131 = ByteCodeReader::ElementUnsigned1_Medium(reader);
    DumpElementUnsigned1<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00131,pFStack_20,reader);
    break;
  case 0x80:
    data_x00134 = ByteCodeReader::ElementC_Medium(reader);
    DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00134,pFStack_20,reader);
    break;
  case 0x81:
    data_x00137 = ByteCodeReader::ElementScopedC_Medium(reader);
    DumpElementScopedC<Js::OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00137,pFStack_20,reader);
    break;
  case 0x82:
    data_x00143 = ByteCodeReader::ElementCP_Medium(reader);
    DumpElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00143,pFStack_20,reader);
    break;
  case 0x83:
    data_x00140 = ByteCodeReader::ProfiledElementCP_Medium(reader);
    DumpProfiledElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00140,pFStack_20,reader);
    break;
  case 0x84:
    data_x00146 = ByteCodeReader::ElementP_Medium(reader);
    DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00146,pFStack_20,reader);
    break;
  case 0x85:
    data_x00149 = ByteCodeReader::ElementPIndexed_Medium(reader);
    DumpElementPIndexed<Js::OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00149,pFStack_20,reader);
    break;
  case 0x86:
    data_x00152 = ByteCodeReader::ElementRootCP_Medium(reader);
    DumpElementRootCP<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00152,pFStack_20,reader);
    break;
  case 0x87:
    data_x00155 = ByteCodeReader::ElementC2_Medium(reader);
    DumpElementC2<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00155,pFStack_20,reader);
    break;
  case 0x88:
    data_x00158 = ByteCodeReader::ElementScopedC2_Medium(reader);
    DumpElementScopedC2<Js::OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00158,pFStack_20,reader);
    break;
  case 0x89:
    data_x00164 = ByteCodeReader::ElementSlot_Medium(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00164,pFStack_20,reader);
    break;
  case 0x8a:
    data_x00161 = ByteCodeReader::ProfiledElementSlot_Medium(reader);
    DumpProfiledElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00161,pFStack_20,reader);
    break;
  case 0x8b:
    data_x00170 = ByteCodeReader::ElementSlotI1_Medium(reader);
    DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00170,pFStack_20,reader);
    break;
  case 0x8c:
    data_x00167 = ByteCodeReader::ProfiledElementSlotI1_Medium(reader);
    DumpProfiledElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00167,pFStack_20,reader);
    break;
  case 0x8d:
    data_x00176 = ByteCodeReader::ElementSlotI2_Medium(reader);
    DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00176,pFStack_20,reader);
    break;
  case 0x8e:
    data_x00173 = ByteCodeReader::ProfiledElementSlotI2_Medium(reader);
    DumpProfiledElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00173,pFStack_20,reader);
    break;
  case 0x8f:
    data_x00182 = ByteCodeReader::ElementSlotI3_Medium(reader);
    DumpElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00182,pFStack_20,reader);
    break;
  case 0x90:
    data_x00179 = ByteCodeReader::ProfiledElementSlotI3_Medium(reader);
    DumpProfiledElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
              (op,data_x00179,pFStack_20,reader);
    break;
  case 0x91:
    data_x00185 = ByteCodeReader::ElementU_Medium(reader);
    DumpElementU<Js::OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00185,pFStack_20,reader);
    break;
  case 0x92:
    data_x00188 = ByteCodeReader::ElementScopedU_Medium(reader);
    DumpElementScopedU<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00188,pFStack_20,reader);
    break;
  case 0x93:
    data_x00191 = ByteCodeReader::ElementRootU_Medium(reader);
    DumpElementRootU<Js::OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00191,pFStack_20,reader);
    break;
  case 0x95:
    data_x00195 = ByteCodeReader::Reg2Int1_Medium(reader);
    DumpReg2Int1<Js::OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00195,pFStack_20,reader);
    break;
  case 0x9a:
    data_x00199 = ByteCodeReader::Reg5_Medium(reader);
    DumpReg5<Js::OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00199,pFStack_20,reader);
    break;
  case 0x9b:
    data_x00202 = ByteCodeReader::Unsigned1_Medium(reader);
    DumpUnsigned1<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00202,pFStack_20,reader);
    break;
  case 0x9d:
    data_02 = ByteCodeReader::Reg1_Large(reader);
    DumpReg1<Js::OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_02,pFStack_20,reader);
    break;
  case 0x9e:
    data_08 = ByteCodeReader::Reg2_Large(reader);
    DumpReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_08,pFStack_20,reader);
    break;
  case 0x9f:
    data_05 = ByteCodeReader::ProfiledReg2_Large(reader);
    DumpProfiledReg2<Js::OpLayoutT_Reg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_05,pFStack_20,reader);
    break;
  case 0xa0:
    data_14 = ByteCodeReader::Reg3_Large(reader);
    DumpReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_14,pFStack_20,reader);
    break;
  case 0xa1:
    data_11 = ByteCodeReader::ProfiledReg3_Large(reader);
    DumpProfiledReg3<Js::OpLayoutT_Reg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_11,pFStack_20,reader);
    break;
  case 0xa2:
    data_17 = ByteCodeReader::Reg3U_Large(reader);
    DumpReg3U<Js::OpLayoutT_Reg3U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_17,pFStack_20,reader);
    break;
  case 0xa3:
    data_20 = ByteCodeReader::Reg4_Large(reader);
    DumpReg4<Js::OpLayoutT_Reg4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_20,pFStack_20,reader);
    break;
  case 0xa4:
    data_23 = ByteCodeReader::Reg4U_Large(reader);
    DumpReg4U<Js::OpLayoutT_Reg4U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_23,pFStack_20,reader);
    break;
  case 0xa5:
    data_26 = ByteCodeReader::Reg5U_Large(reader);
    DumpReg5U<Js::OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_26,pFStack_20,reader);
    break;
  case 0xa6:
    data_32 = ByteCodeReader::Reg1Unsigned1_Large(reader);
    DumpReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_32,pFStack_20,reader);
    break;
  case 0xa7:
    data_29 = ByteCodeReader::ProfiledReg1Unsigned1_Large(reader);
    DumpProfiledReg1Unsigned1<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_29,pFStack_20,reader);
    break;
  case 0xa8:
    data_35 = ByteCodeReader::Reg2U_Large(reader);
    DumpReg2U<Js::OpLayoutT_Reg2U<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_35,pFStack_20,reader);
    break;
  case 0xa9:
    data_38 = ByteCodeReader::Reg2B1_Large(reader);
    DumpReg2B1<Js::OpLayoutT_Reg2B1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_38,pFStack_20,reader);
    break;
  case 0xaa:
    data_41 = ByteCodeReader::Reg3B1_Large(reader);
    DumpReg3B1<Js::OpLayoutT_Reg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_41,pFStack_20,reader);
    break;
  case 0xab:
    data_44 = ByteCodeReader::Reg3C_Large(reader);
    DumpReg3C<Js::OpLayoutT_Reg3C<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_44,pFStack_20,reader);
    break;
  case 0xac:
    data_50 = ByteCodeReader::Arg_Large(reader);
    DumpArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_50,pFStack_20,reader);
    break;
  case 0xad:
    data_47 = ByteCodeReader::ProfiledArg_Large(reader);
    DumpProfiledArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_47,pFStack_20,reader);
    break;
  case 0xae:
    data_53 = ByteCodeReader::ArgNoSrc_Large(reader);
    DumpArgNoSrc<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_53,pFStack_20,reader);
    break;
  case 0xb1:
    data_58 = ByteCodeReader::BrReg1_Large(reader);
    DumpBrReg1<Js::OpLayoutT_BrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_58,pFStack_20,reader);
    break;
  case 0xb2:
    data_61 = ByteCodeReader::BrReg2_Large(reader);
    DumpBrReg2<Js::OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_61,pFStack_20,reader);
    break;
  case 0xb3:
    data_64 = ByteCodeReader::BrReg1Unsigned1_Large(reader);
    DumpBrReg1Unsigned1<Js::OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_64,pFStack_20,reader);
    break;
  case 0xb9:
    data_75 = ByteCodeReader::CallI_Large(reader);
    DumpCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_75,pFStack_20,reader);
    break;
  case 0xba:
    data_72 = ByteCodeReader::ProfiledCallI_Large(reader);
    DumpProfiledCallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_72,pFStack_20,reader);
    break;
  case 0xbb:
    data_78 = ByteCodeReader::Profiled2CallI_Large(reader);
    DumpProfiled2CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_78,pFStack_20,reader);
    break;
  case 0xbc:
    data_84 = ByteCodeReader::CallIFlags_Large(reader);
    DumpCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_84,pFStack_20,reader);
    break;
  case 0xbd:
    data_81 = ByteCodeReader::ProfiledCallIFlags_Large(reader);
    DumpProfiledCallIFlags<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_81,pFStack_20,reader);
    break;
  case 0xbe:
    data_90 = ByteCodeReader::CallIWithICIndex_Large(reader);
    DumpCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_90,pFStack_20,reader);
    break;
  case 0xbf:
    data_87 = ByteCodeReader::ProfiledCallIWithICIndex_Large(reader);
    DumpProfiledCallIWithICIndex<Js::OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_87,pFStack_20,reader);
    break;
  case 0xc0:
    data_96 = ByteCodeReader::CallIFlagsWithICIndex_Large(reader);
    DumpCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_96,pFStack_20,reader);
    break;
  case 0xc1:
    data_93 = ByteCodeReader::ProfiledCallIFlagsWithICIndex_Large(reader);
    DumpProfiledCallIFlagsWithICIndex<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_93,pFStack_20,reader);
    break;
  case 0xc2:
    data_x00102 = ByteCodeReader::CallIExtended_Large(reader);
    DumpCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00102,pFStack_20,reader);
    break;
  case 0xc3:
    data_99 = ByteCodeReader::ProfiledCallIExtended_Large(reader);
    DumpProfiledCallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_99,pFStack_20,reader);
    break;
  case 0xc4:
    data_x00105 = ByteCodeReader::Profiled2CallIExtended_Large(reader);
    DumpProfiled2CallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00105,pFStack_20,reader);
    break;
  case 0xc5:
    data_x00111 = ByteCodeReader::CallIExtendedFlags_Large(reader);
    DumpCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00111,pFStack_20,reader);
    break;
  case 0xc6:
    data_x00108 = ByteCodeReader::ProfiledCallIExtendedFlags_Large(reader);
    DumpProfiledCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00108,pFStack_20,reader);
    break;
  case 199:
    data_x00117 = ByteCodeReader::CallIExtendedWithICIndex_Large(reader);
    DumpCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00117,pFStack_20,reader);
    break;
  case 200:
    data_x00114 = ByteCodeReader::ProfiledCallIExtendedWithICIndex_Large(reader);
    DumpProfiledCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00114,pFStack_20,reader);
    break;
  case 0xc9:
    data_x00123 = ByteCodeReader::CallIExtendedFlagsWithICIndex_Large(reader);
    DumpCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00123,pFStack_20,reader);
    break;
  case 0xca:
    data_x00120 = ByteCodeReader::ProfiledCallIExtendedFlagsWithICIndex_Large(reader);
    DumpProfiledCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00120,pFStack_20,reader);
    break;
  case 0xcb:
    data_x00129 = ByteCodeReader::ElementI_Large(reader);
    DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00129,pFStack_20,reader);
    break;
  case 0xcc:
    data_x00126 = ByteCodeReader::ProfiledElementI_Large(reader);
    DumpProfiledElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00126,pFStack_20,reader);
    break;
  case 0xcd:
    data_x00132 = ByteCodeReader::ElementUnsigned1_Large(reader);
    DumpElementUnsigned1<Js::OpLayoutT_ElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00132,pFStack_20,reader);
    break;
  case 0xce:
    data_x00135 = ByteCodeReader::ElementC_Large(reader);
    DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00135,pFStack_20,reader);
    break;
  case 0xcf:
    data_x00138 = ByteCodeReader::ElementScopedC_Large(reader);
    DumpElementScopedC<Js::OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00138,pFStack_20,reader);
    break;
  case 0xd0:
    data_x00144 = ByteCodeReader::ElementCP_Large(reader);
    DumpElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00144,pFStack_20,reader);
    break;
  case 0xd1:
    data_x00141 = ByteCodeReader::ProfiledElementCP_Large(reader);
    DumpProfiledElementCP<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00141,pFStack_20,reader);
    break;
  case 0xd2:
    data_x00147 = ByteCodeReader::ElementP_Large(reader);
    DumpElementP<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00147,pFStack_20,reader);
    break;
  case 0xd3:
    data_x00150 = ByteCodeReader::ElementPIndexed_Large(reader);
    DumpElementPIndexed<Js::OpLayoutT_ElementPIndexed<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00150,pFStack_20,reader);
    break;
  case 0xd4:
    data_x00153 = ByteCodeReader::ElementRootCP_Large(reader);
    DumpElementRootCP<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00153,pFStack_20,reader);
    break;
  case 0xd5:
    data_x00156 = ByteCodeReader::ElementC2_Large(reader);
    DumpElementC2<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00156,pFStack_20,reader);
    break;
  case 0xd6:
    data_x00159 = ByteCodeReader::ElementScopedC2_Large(reader);
    DumpElementScopedC2<Js::OpLayoutT_ElementScopedC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00159,pFStack_20,reader);
    break;
  case 0xd7:
    data_x00165 = ByteCodeReader::ElementSlot_Large(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00165,pFStack_20,reader);
    break;
  case 0xd8:
    data_x00162 = ByteCodeReader::ProfiledElementSlot_Large(reader);
    DumpProfiledElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00162,pFStack_20,reader);
    break;
  case 0xd9:
    data_x00171 = ByteCodeReader::ElementSlotI1_Large(reader);
    DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00171,pFStack_20,reader);
    break;
  case 0xda:
    data_x00168 = ByteCodeReader::ProfiledElementSlotI1_Large(reader);
    DumpProfiledElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00168,pFStack_20,reader);
    break;
  case 0xdb:
    data_x00177 = ByteCodeReader::ElementSlotI2_Large(reader);
    DumpElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00177,pFStack_20,reader);
    break;
  case 0xdc:
    data_x00174 = ByteCodeReader::ProfiledElementSlotI2_Large(reader);
    DumpProfiledElementSlotI2<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00174,pFStack_20,reader);
    break;
  case 0xdd:
    data_x00183 = ByteCodeReader::ElementSlotI3_Large(reader);
    DumpElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00183,pFStack_20,reader);
    break;
  case 0xde:
    data_x00180 = ByteCodeReader::ProfiledElementSlotI3_Large(reader);
    DumpProfiledElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
              (op,data_x00180,pFStack_20,reader);
    break;
  case 0xdf:
    data_x00186 = ByteCodeReader::ElementU_Large(reader);
    DumpElementU<Js::OpLayoutT_ElementU<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00186,pFStack_20,reader);
    break;
  case 0xe0:
    data_x00189 = ByteCodeReader::ElementScopedU_Large(reader);
    DumpElementScopedU<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00189,pFStack_20,reader);
    break;
  case 0xe1:
    data_x00192 = ByteCodeReader::ElementRootU_Large(reader);
    DumpElementRootU<Js::OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00192,pFStack_20,reader);
    break;
  case 0xe3:
    data_x00196 = ByteCodeReader::Reg2Int1_Large(reader);
    DumpReg2Int1<Js::OpLayoutT_Reg2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00196,pFStack_20,reader);
    break;
  case 0xe8:
    data_x00200 = ByteCodeReader::Reg5_Large(reader);
    DumpReg5<Js::OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00200,pFStack_20,reader);
    break;
  case 0xe9:
    data_x00203 = ByteCodeReader::Unsigned1_Large(reader);
    DumpUnsigned1<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00203,pFStack_20,reader);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpOp(OpCode op, LayoutSize layoutSize, ByteCodeReader& reader, FunctionBody* dumpFunction)
    {
        Output::Print(_u("%-20s"), OpCodeUtil::GetOpCodeName(op));
        OpLayoutType nType = OpCodeUtil::GetOpCodeLayout(op);
        switch (layoutSize * OpLayoutType::Count + nType)
        {
#define LAYOUT_TYPE(layout) \
            case OpLayoutType::layout: \
                Assert(layoutSize == SmallLayout); \
                Dump##layout(op, reader.layout(), dumpFunction, reader); \
                break;

#define LAYOUT_SCHEMA(type, layout) \
            case type##Layout * OpLayoutType::Count + OpLayoutType::layout: \
                Dump##layout(op, reader.layout##_##type(), dumpFunction, reader); \
                break

#define LAYOUT_TYPE_WMS(layout) \
            LAYOUT_SCHEMA(Small,  layout); \
            LAYOUT_SCHEMA(Medium, layout); \
            LAYOUT_SCHEMA(Large,  layout);

#define LAYOUT_TYPE_PROFILED_WMS(layout) \
            LAYOUT_TYPE_WMS(Profiled##layout) \
            LAYOUT_TYPE_WMS(layout)

#include "LayoutTypes.h"

            default:
            {
                AssertMsg(false, "Unknown OpLayout");
                break;
            }
        }
    }